

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parseGenericReply_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  element_type *peVar1;
  long lVar2;
  pointer_____offset_0x10___ *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  Ptr local_40;
  
  peVar1 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_001c387f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    this_00 = &GenericReply::typeinfo;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar2 = __dynamic_cast(peVar1,&GenericReply::typeinfo,&ForceReply::typeinfo,0);
    if ((lVar2 != 0) &&
       (p_Var3 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi, p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
    {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (lVar2 == 0) {
      peVar1 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        bVar4 = true;
      }
      else {
        this_00 = &GenericReply::typeinfo;
        lVar2 = __dynamic_cast(peVar1,&GenericReply::typeinfo,&ReplyKeyboardRemove::typeinfo,0);
        bVar4 = lVar2 == 0;
      }
      if (bVar4) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var3 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (bVar4) {
        peVar1 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1 == (element_type *)0x0) {
          bVar4 = true;
        }
        else {
          lVar2 = __dynamic_cast(peVar1,&GenericReply::typeinfo,&ReplyKeyboardMarkup::typeinfo,0);
          bVar4 = lVar2 == 0;
        }
        if (bVar4) {
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var3 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (bVar4) {
          peVar1 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (peVar1 == (element_type *)0x0) {
            bVar4 = true;
          }
          else {
            lVar2 = __dynamic_cast(peVar1,&GenericReply::typeinfo,&InlineKeyboardMarkup::typeinfo,0)
            ;
            bVar4 = lVar2 == 0;
          }
          if (bVar4) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var3 = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              }
            }
          }
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (bVar4) goto LAB_001c387f;
          local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          parseInlineKeyboardMarkup_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_40);
        }
        else {
          local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          parseReplyKeyboardMarkup_abi_cxx11_(__return_storage_ptr__,this,(Ptr *)&local_40);
        }
      }
      else {
        local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        parseReplyKeyboardRemove_abi_cxx11_
                  (__return_storage_ptr__,(TgTypeParser *)this_00,(Ptr *)&local_40);
      }
    }
    else {
      local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (object->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
      if (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      parseForceReply_abi_cxx11_(__return_storage_ptr__,(TgTypeParser *)this_00,&local_40);
    }
    if (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<TgBot::ForceReply,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseGenericReply(const GenericReply::Ptr& object) const {
    if (!object) {
        return "";
    }
    if (dynamic_pointer_cast<ForceReply>(object) != nullptr) {
        return parseForceReply(static_pointer_cast<ForceReply>(object));
    } else if (dynamic_pointer_cast<ReplyKeyboardRemove>(object) != nullptr) {
        return parseReplyKeyboardRemove(static_pointer_cast<ReplyKeyboardRemove>(object));
    } else if (dynamic_pointer_cast<ReplyKeyboardMarkup>(object) != nullptr){
        return parseReplyKeyboardMarkup(static_pointer_cast<ReplyKeyboardMarkup>(object));
    } else if (dynamic_pointer_cast<InlineKeyboardMarkup>(object) != nullptr){
        return parseInlineKeyboardMarkup(static_pointer_cast<InlineKeyboardMarkup>(object));
    }
    return "";
}